

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall
bloaty::Rollup::CreateRows
          (Rollup *this,RollupRow *row,Rollup *base,Options *options,bool is_toplevel)

{
  long lVar1;
  pointer pRVar2;
  int iVar3;
  long lVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
  _Var5;
  _Hash_node_base *p_Var6;
  long *plVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long local_58;
  long lStack_50;
  
  if (base != (Rollup *)0x0) {
    lVar1 = base->vm_total_;
    lVar4 = this->vm_total_ - lVar1;
    if (lVar1 == 0) {
      if (this->vm_total_ == 0) {
        dVar8 = NAN;
      }
      else {
        dVar8 = *(double *)(&DAT_003082c0 + (ulong)(0 < lVar4) * 8);
      }
    }
    else {
      dVar8 = ((double)lVar4 / (double)lVar1) * 100.0;
    }
    row->vmpercent = dVar8;
    lVar1 = base->file_total_;
    lVar4 = this->file_total_ - lVar1;
    if (lVar1 == 0) {
      if (this->file_total_ == 0) {
        dVar8 = NAN;
      }
      else {
        dVar8 = *(double *)(&DAT_003082c0 + (ulong)(0 < lVar4) * 8);
      }
    }
    else {
      dVar8 = ((double)lVar4 / (double)lVar1) * 100.0;
    }
    row->filepercent = dVar8;
  }
  p_Var6 = (this->children_)._M_h._M_before_begin._M_nxt;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      _Var5._M_cur = (__node_type *)p_Var6[5]._M_nxt;
      auVar10 = *(undefined1 (*) [16])_Var5._M_cur;
      if (base == (Rollup *)0x0) {
        plVar7 = (long *)0x0;
      }
      else {
        _Var5._M_cur = (__node_type *)
                       std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&(base->children_)._M_h,(key_type *)(p_Var6 + 1));
        if (_Var5._M_cur == (__node_type *)0x0) {
          plVar7 = (long *)0x0;
        }
        else {
          plVar7 = *(long **)((long)_Var5._M_cur + 0x28);
          local_58 = auVar10._0_8_;
          lStack_50 = auVar10._8_8_;
          auVar10._0_8_ = local_58 - *plVar7;
          auVar10._8_8_ = lStack_50 - plVar7[1];
        }
      }
      auVar9._0_4_ = -(uint)(auVar10._0_4_ == 0);
      auVar9._4_4_ = -(uint)(auVar10._4_4_ == 0);
      auVar9._8_4_ = -(uint)(auVar10._8_4_ == 0);
      auVar9._12_4_ = -(uint)(auVar10._12_4_ == 0);
      iVar3 = movmskps((int)_Var5._M_cur,auVar9);
      if (iVar3 != 0xf) {
        std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>> *)
                   &row->sorted_children,(key_type *)(p_Var6 + 1));
        pRVar2 = (row->sorted_children).
                 super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_58 = auVar10._0_8_;
        lStack_50 = auVar10._8_8_;
        pRVar2[-1].size.vm = local_58;
        pRVar2[-1].size.file = lStack_50;
        if (plVar7 != (long *)0x0) {
          lVar1 = plVar7[1];
          pRVar2[-1].old_size.vm = *plVar7;
          pRVar2[-1].old_size.file = lVar1;
        }
      }
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  SortAndAggregateRows(this,row,base,options,is_toplevel);
  return;
}

Assistant:

void Rollup::CreateRows(RollupRow* row, const Rollup* base,
                        const Options& options, bool is_toplevel) const {
  if (base) {
    // For a diff, the percentage is a comparison against the previous size of
    // the same label at the same level.
    row->vmpercent = Percent(vm_total_ - base->vm_total_, base->vm_total_);
    row->filepercent = Percent(file_total_ - base->file_total_, base->file_total_);
  }

  for (const auto& value : children_) {
    int64_t vm_total = value.second->vm_total_;
    int64_t file_total = value.second->file_total_;
    Rollup* base_child = nullptr;

    if (base) {
      // Reassign sizes to base during a diff to compare to target sizes.
      auto it = base->children_.find(value.first);
      if (it != base->children_.end()) {
        base_child = it->second.get();
        vm_total -= base_child->vm_total_;
        file_total -= base_child->file_total_;
      }
    }

    if (vm_total != 0 || file_total != 0) {
      row->sorted_children.emplace_back(value.first);
      RollupRow& child_row = row->sorted_children.back();
      child_row.size.vm = vm_total;
      child_row.size.file = file_total;

      // Preserve the old size for this label in the RollupRow output.
      // If there is a diff base, the old sizes come from the size of the label
      // in that base.  Otherwise, the old size stays 0.
      if (base_child) {
        child_row.old_size.vm = base_child->vm_total_;
        child_row.old_size.file = base_child->file_total_;
      }
    }
  }

  SortAndAggregateRows(row, base, options, is_toplevel);
}